

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

ImportDefinition * __thiscall
flatbuffers::ts::TsGenerator::AddImport<flatbuffers::EnumDef>
          (ImportDefinition *__return_storage_ptr__,TsGenerator *this,import_set *imports,
          Definition *dependent,EnumDef *dependency)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  size_type_conflict sVar4;
  char *__s;
  string *local_4c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
  local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  allocator<char> local_249;
  undefined1 local_248 [8];
  string import_extension;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  byte local_19b;
  byte local_19a;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  byte local_172;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ulong local_150;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dep_comps;
  string rel_file_path;
  string bare_file_path;
  string symbols_expression;
  string object_name;
  string name;
  undefined1 local_98 [7];
  bool has_name_clash;
  string import_name;
  _Self local_70 [3];
  _Self local_58;
  iterator import_pair;
  string unique_name;
  EnumDef *dependency_local;
  Definition *dependent_local;
  import_set *imports_local;
  TsGenerator *this_local;
  ImportDefinition *import;
  
  GetTypeName_abi_cxx11_((string *)&import_pair,this,dependency,false,true);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
       ::find(imports,(string *)&import_pair);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
       ::end(imports);
  bVar2 = std::operator!=(&local_58,local_70);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>
             ::operator->(&local_58);
    anon_unknown_10::ImportDefinition::ImportDefinition(__return_storage_ptr__,&ppVar3->second);
    import_name.field_2._12_4_ = 1;
  }
  else {
    GetTypeName_abi_cxx11_((string *)local_98,this,dependency,false,false);
    bVar2 = CheckIfNameClashes(imports,(string *)local_98);
    if (bVar2) {
      local_4c0 = (string *)&import_pair;
    }
    else {
      local_4c0 = (string *)local_98;
    }
    std::__cxx11::string::string((string *)(object_name.field_2._M_local_buf + 8),local_4c0);
    GetTypeName_abi_cxx11_
              ((string *)((long)&symbols_expression.field_2 + 8),this,dependency,true,bVar2);
    GenSymbolExpression((string *)((long)&bare_file_path.field_2 + 8),this,dependency,bVar2,
                        (string *)local_98,(string *)((long)&object_name.field_2 + 8),
                        (string *)((long)&symbols_expression.field_2 + 8));
    std::__cxx11::string::string((string *)(rel_file_path.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&dep_comps);
    i = (size_t)dependent->defined_namespace;
    for (local_150 = 0; uVar1 = local_150,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)i), uVar1 < sVar4; local_150 = local_150 + 1) {
      local_172 = 0;
      local_19a = 0;
      local_19b = 0;
      if (local_150 == 0) {
        std::allocator<char>::allocator();
        local_172 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"..",&local_171);
      }
      else {
        std::allocator<char>::allocator();
        local_19a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"..",&local_199);
        local_19b = 1;
        std::operator+(&local_170,'/',&local_198);
      }
      std::__cxx11::string::operator+=((string *)&dep_comps,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      if ((local_19b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_198);
      }
      if ((local_19a & 1) != 0) {
        std::allocator<char>::~allocator(&local_199);
      }
      if ((local_172 & 1) != 0) {
        std::allocator<char>::~allocator(&local_171);
      }
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)i);
    if (sVar4 == 0) {
      std::__cxx11::string::operator+=((string *)&dep_comps,".");
    }
    Namer::Directories(&local_200,&(this->namer_).super_Namer,
                       &((dependency->super_Definition).defined_namespace)->components,OutputPath,
                       kUpperCamel);
    std::operator+(&local_1e0,'/',&local_200);
    Namer::File<flatbuffers::EnumDef>
              (&local_220,&(this->namer_).super_Namer,dependency,SuffixAndExtension);
    std::operator+(&local_1c0,&local_1e0,&local_220);
    std::__cxx11::string::operator+=
              ((string *)(rel_file_path.field_2._M_local_buf + 8),(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::operator+=
              ((string *)&dep_comps,(string *)(rel_file_path.field_2._M_local_buf + 8));
    import_extension.field_2._M_local_buf[0xf] = '\0';
    anon_unknown_10::ImportDefinition::ImportDefinition(__return_storage_ptr__);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(object_name.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->object_name,
               (string *)(symbols_expression.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->bare_file_path,
               (string *)(rel_file_path.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->rel_file_path,(string *)&dep_comps);
    __s = ".js";
    if (((((this->super_BaseGenerator).parser_)->opts).ts_no_import_ext & 1U) != 0) {
      __s = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_248,__s,&local_249);
    std::allocator<char>::~allocator(&local_249);
    std::operator+(&local_2f0,"import { ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bare_file_path.field_2 + 8));
    std::operator+(&local_2d0,&local_2f0," } from \'");
    std::operator+(&local_2b0,&local_2d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep_comps);
    std::operator+(&local_290,&local_2b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
    std::operator+(&local_270,&local_290,"\';");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->import_statement,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::operator+(&local_390,"export { ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&bare_file_path.field_2 + 8));
    std::operator+(&local_370,&local_390," } from \'.");
    std::operator+(&local_350,&local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&rel_file_path.field_2 + 8));
    std::operator+(&local_330,&local_350,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
    std::operator+(&local_310,&local_330,"\';");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->export_statement,(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    __return_storage_ptr__->dependency = &dependency->super_Definition;
    __return_storage_ptr__->dependent = dependent;
    std::
    make_pair<std::__cxx11::string_const&,flatbuffers::(anonymous_namespace)::ImportDefinition&>
              (&local_480,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&import_pair,
               __return_storage_ptr__);
    std::
    map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
    ::insert<std::pair<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition>>
              ((map<std::__cxx11::string,flatbuffers::(anonymous_namespace)::ImportDefinition,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::(anonymous_namespace)::ImportDefinition>>>
                *)imports,&local_480);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>
    ::~pair(&local_480);
    import_extension.field_2._M_local_buf[0xf] = '\x01';
    import_name.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_248);
    if ((import_extension.field_2._M_local_buf[0xf] & 1U) == 0) {
      anon_unknown_10::ImportDefinition::~ImportDefinition(__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&dep_comps);
    std::__cxx11::string::~string((string *)(rel_file_path.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(bare_file_path.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(symbols_expression.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(object_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_98);
  }
  std::__cxx11::string::~string((string *)&import_pair);
  return __return_storage_ptr__;
}

Assistant:

ImportDefinition AddImport(import_set &imports, const Definition &dependent,
                             const DefinitionT &dependency) {
    // The unique name of the dependency, fully qualified in its namespace.
    const std::string unique_name = GetTypeName(
        dependency, /*object_api = */ false, /*force_ns_wrap=*/true);

    // Look if we have already added this import and return its name if found.
    const auto import_pair = imports.find(unique_name);
    if (import_pair != imports.end()) { return import_pair->second; }

    // Check if this name would have a name clash with another type. Just use
    // the "base" name (properly escaped) without any namespacing applied.
    const std::string import_name = GetTypeName(dependency);
    const bool has_name_clash = CheckIfNameClashes(imports, import_name);

    // If we have a name clash, use the unique name, otherwise use simple name.
    std::string name = has_name_clash ? unique_name : import_name;

    const std::string object_name =
        GetTypeName(dependency, /*object_api=*/true, has_name_clash);

    const std::string symbols_expression = GenSymbolExpression(
        dependency, has_name_clash, import_name, name, object_name);

    std::string bare_file_path;
    std::string rel_file_path;
    const auto &dep_comps = dependent.defined_namespace->components;
    for (size_t i = 0; i < dep_comps.size(); i++) {
      rel_file_path += i == 0 ? ".." : (kPathSeparator + std::string(".."));
    }
    if (dep_comps.size() == 0) { rel_file_path += "."; }

    bare_file_path +=
        kPathSeparator +
        namer_.Directories(dependency.defined_namespace->components,
                           SkipDir::OutputPath) +
        namer_.File(dependency, SkipFile::SuffixAndExtension);
    rel_file_path += bare_file_path;

    ImportDefinition import;
    import.name = name;
    import.object_name = object_name;
    import.bare_file_path = bare_file_path;
    import.rel_file_path = rel_file_path;
    std::string import_extension = parser_.opts.ts_no_import_ext ? "" : ".js";
    import.import_statement = "import { " + symbols_expression + " } from '" +
                              rel_file_path + import_extension + "';";
    import.export_statement = "export { " + symbols_expression + " } from '." +
                              bare_file_path + import_extension + "';";
    import.dependency = &dependency;
    import.dependent = &dependent;

    imports.insert(std::make_pair(unique_name, import));

    return import;
  }